

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split_string(string *str,char delimeter)

{
  bool bVar1;
  value_type *__x;
  char in_DL;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string item;
  istringstream iss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strs;
  string local_1b8 [32];
  istringstream local_198 [391];
  char local_11;
  
  local_11 = in_DL;
  std::__cxx11::istringstream::istringstream(local_198,in_RSI,_S_in);
  std::__cxx11::string::string(local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1150dd);
  while( true ) {
    __x = (value_type *)
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_198,local_1b8,local_11);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)(&__x->_M_dataplus + *(long *)(*(long *)__x + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_RDI,__x);
  }
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::istringstream::~istringstream(local_198);
  return in_RDI;
}

Assistant:

std::vector<std::string> split_string(const std::string &str, char delimeter) {
	std::istringstream iss(str);
	std::string item;
	std::vector<std::string> strs;
	while (std::getline(iss, item, delimeter)) {
		strs.push_back(item);
	}
	return strs;
}